

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExportRef
BinaryenAddTableExport(BinaryenModuleRef module,char *internalName,char *externalName)

{
  Export *curr;
  Name local_40;
  
  curr = (Export *)operator_new(0x28);
  (curr->name).super_IString.str._M_len = 0;
  (curr->name).super_IString.str._M_str = (char *)0x0;
  (curr->value).super_IString.str._M_len = 0;
  (curr->value).super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&curr->kind = 0;
  wasm::Name::Name(&local_40,internalName);
  (curr->value).super_IString.str._M_len = local_40.super_IString.str._M_len;
  (curr->value).super_IString.str._M_str = local_40.super_IString.str._M_str;
  wasm::Name::Name(&local_40,externalName);
  (curr->name).super_IString.str._M_len = local_40.super_IString.str._M_len;
  (curr->name).super_IString.str._M_str = local_40.super_IString.str._M_str;
  curr->kind = Table;
  wasm::Module::addExport(module,curr);
  return curr;
}

Assistant:

BinaryenExportRef BinaryenAddTableExport(BinaryenModuleRef module,
                                         const char* internalName,
                                         const char* externalName) {
  auto* ret = new Export();
  ret->value = internalName;
  ret->name = externalName;
  ret->kind = ExternalKind::Table;
  ((Module*)module)->addExport(ret);
  return ret;
}